

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O0

double __thiscall
imrt::IntensityILS::iLocalSearch(IntensityILS *this,Plan *P,double max_time,bool verbose)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  reference ppSVar4;
  iterator this_00;
  reference ppVar5;
  Plan *this_01;
  double *intensity_00;
  ostream *this_02;
  byte in_DL;
  Plan *in_RSI;
  Station *in_RDI;
  Station *s_00;
  double dVar6;
  double delta_eval;
  double old;
  double intensity;
  int j;
  int i;
  int b;
  int a;
  pair<int,_int> cell;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> cells;
  Station *s;
  const_iterator __end1;
  const_iterator __begin1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__range1;
  double eval;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffea8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *in_stack_fffffffffffffeb0;
  ostream *in_stack_fffffffffffffec0;
  Station *pSVar7;
  Station *in_stack_fffffffffffffee0;
  Station *in_stack_fffffffffffffee8;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  _func_int **intensity_01;
  Station *pSVar8;
  int y;
  int x;
  int iVar9;
  pair<int,_int> pVar10;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [24];
  Station *local_90;
  _Self local_88;
  _Self local_80;
  undefined1 *local_78;
  Station *local_60;
  undefined1 local_40 [31];
  byte local_21;
  Plan *local_18;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *local_8;
  
  local_21 = in_DL & 1;
  local_18 = in_RSI;
  Plan::get_stations_abi_cxx11_(in_RSI);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            (in_stack_fffffffffffffef0,
             (list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)in_stack_fffffffffffffee8);
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x161292);
  s_00 = (Station *)Plan::getEvaluation(local_18);
  local_78 = local_40;
  local_60 = s_00;
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                 (in_stack_fffffffffffffea8);
  local_88._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                 (in_stack_fffffffffffffea8);
  do {
    bVar2 = std::operator!=(&local_80,&local_88);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppSVar4 = std::_List_const_iterator<imrt::Station_*>::operator*
                        ((_List_const_iterator<imrt::Station_*> *)in_stack_fffffffffffffeb0);
    local_90 = *ppSVar4;
    getShuffledCells((IntensityILS *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     s_00);
    local_b0 = local_a8;
    local_b8._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                   ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    in_stack_fffffffffffffea8);
    this_00 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         in_stack_fffffffffffffea8);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffeb0,
                              (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_fffffffffffffea8), bVar2) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_b8);
      pVar10 = *ppVar5;
      iVar3 = rand();
      iVar3 = iVar3 % 2;
      for (iVar9 = 0; iVar9 < 2; iVar9 = iVar9 + 1) {
        x = pVar10.first;
        y = pVar10.second;
        this_01 = (Plan *)maths::Matrix::operator()(&local_90->I,x,y);
        intensity_01 = this_01->_vptr_Plan;
        if (iVar3 == iVar9) {
          in_stack_fffffffffffffee8 =
               (Station *)
               Station::intensityUp
                         ((Station *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                          (int)((ulong)s_00 >> 0x20),(int)s_00);
          pSVar7 = in_stack_fffffffffffffee8;
        }
        else {
          in_stack_fffffffffffffee0 =
               (Station *)Station::intensityDown(in_RDI,(int)((ulong)this_01 >> 0x20),(int)this_01);
          pSVar7 = in_stack_fffffffffffffee0;
        }
        pSVar8 = pSVar7;
        intensity_00 = maths::Matrix::operator()(&local_90->I,x,y);
        if ((((double)pSVar7 != *intensity_00) || (NAN((double)pSVar7) || NAN(*intensity_00))) &&
           (dVar6 = Plan::get_delta_eval
                              (this_01,in_stack_fffffffffffffee8,
                               (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                               (int)in_stack_fffffffffffffee0,(double)intensity_00,
                               (int)((ulong)pSVar7 >> 0x20)), dVar6 < -0.05)) {
          in_stack_fffffffffffffec0 = (ostream *)std::ostream::operator<<(&std::cout,dVar6);
          this_02 = std::operator<<(in_stack_fffffffffffffec0,":");
          in_stack_fffffffffffffeb0 =
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                *)std::ostream::operator<<(this_02,(double)pSVar8 - (double)intensity_01);
          std::ostream::operator<<(in_stack_fffffffffffffeb0,std::endl<char,std::char_traits<char>>)
          ;
          Station::change_intensity
                    ((Station *)this_00._M_current,pVar10.second,pVar10.first,
                     (double)CONCAT44(iVar3,iVar9),
                     (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     CONCAT44(x,y));
          in_stack_fffffffffffffea8 =
               (list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               Plan::incremental_eval
                         ((Plan *)CONCAT44(iVar3,iVar9),(Station *)CONCAT44(x,y),
                          (int)((ulong)pSVar8 >> 0x20),(int)pSVar8,(double)intensity_01);
          in_stack_ffffffffffffff0c = 1;
          local_8 = in_stack_fffffffffffffea8;
          goto LAB_001616a2;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_b8);
    }
    in_stack_ffffffffffffff0c = 0;
LAB_001616a2:
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffec0);
    if (in_stack_ffffffffffffff0c != 0) {
      std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~list
                ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x1616dc)
      ;
      std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~list
                ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x1616e9);
      return (double)local_8;
    }
    std::_List_const_iterator<imrt::Station_*>::operator++(&local_80);
  } while( true );
}

Assistant:

double IntensityILS::iLocalSearch(Plan& P, double max_time, bool verbose){
		 const list<Station*> stations=P.get_stations();
		 list< pair< int, double > > diff;
		 double eval =P.getEvaluation();

		 for(auto s:stations){
			  vector < pair<int, int> > cells = getShuffledCells(s);
				for(auto cell:cells){
					int a=rand()%2;
					for(int b=0; b<2;b++){
					  int i=cell.first, j=cell.second;
            double intensity, old=s->I(i,j);
						if(a==b) intensity=s->intensityUp(i,j);
						else intensity=s->intensityDown(i,j);
						if(intensity==s->I(i,j)) continue;
            double delta_eval = P.get_delta_eval (*s, i, j, intensity-old);

						if(delta_eval<-0.05){
              cout << delta_eval << ":" << intensity-old << endl;
              //cout << P.getEvaluationFunction()->get_impact_beamlet(s->getAngle(),s->pos2beam[make_pair(i,j)]) << endl;
              s->change_intensity(i, j, intensity);
              return P.incremental_eval(*s, i, j, intensity-old);
            }

					}
				}
		 }
	 }